

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int32 it_read_sample_data(IT_SAMPLE *sample,uchar convert,DUMBFILE *f)

{
  int iVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  DUMBFILE *in_RDX;
  byte in_SIL;
  long in_RDI;
  int32 datasize;
  int32 n;
  undefined7 in_stack_00000010;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  short *in_stack_00000030;
  DUMBFILE *in_stack_00000038;
  int32 local_4;
  
  iVar1 = *(int *)(in_RDI + 0x38);
  if ((*(byte *)(in_RDI + 0x32) & 4) != 0) {
    iVar1 = iVar1 << 1;
  }
  iVar4 = 1;
  if ((*(byte *)(in_RDI + 0x32) & 2) != 0) {
    iVar4 = 2;
  }
  pvVar5 = malloc((long)(iVar1 * iVar4));
  *(void **)(in_RDI + 0x58) = pvVar5;
  if (*(long *)(in_RDI + 0x58) == 0) {
    local_4 = -1;
  }
  else {
    if (((*(byte *)(in_RDI + 0x32) & 2) == 0) && (in_SIL == 0xff)) {
      iVar2 = _dumb_it_read_sample_data_adpcm4
                        (sample,(DUMBFILE *)CONCAT17(convert,in_stack_00000010));
      if (iVar2 < 0) {
        return -1;
      }
    }
    else if ((*(byte *)(in_RDI + 0x32) & 8) == 0) {
      if ((*(byte *)(in_RDI + 0x32) & 2) == 0) {
        if ((*(byte *)(in_RDI + 0x32) & 4) == 0) {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,iVar1));
            *(char *)(*(long *)(in_RDI + 0x58) + (long)iVar4) = (char)iVar3;
          }
        }
        else {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 2) {
            iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,iVar1));
            *(char *)(*(long *)(in_RDI + 0x58) + (long)iVar4) = (char)iVar3;
          }
          for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 2) {
            iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,iVar1));
            *(char *)(*(long *)(in_RDI + 0x58) + (long)iVar4) = (char)iVar3;
          }
        }
      }
      else if ((*(byte *)(in_RDI + 0x32) & 4) == 0) {
        if ((in_SIL & 2) == 0) {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            iVar3 = dumbfile_igetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
            *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
          }
        }
        else {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            iVar3 = dumbfile_mgetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
            *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
          }
        }
      }
      else if ((in_SIL & 2) == 0) {
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 2) {
          iVar3 = dumbfile_igetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
          *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
        }
        for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 2) {
          iVar3 = dumbfile_igetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
          *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
        }
      }
      else {
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 2) {
          iVar3 = dumbfile_mgetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
          *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
        }
        for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 2) {
          iVar3 = dumbfile_mgetw((DUMBFILE *)CONCAT44(iVar4,iVar1));
          *(short *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) = (short)iVar3;
        }
      }
    }
    else if ((*(byte *)(in_RDI + 0x32) & 4) == 0) {
      if ((*(byte *)(in_RDI + 0x32) & 2) == 0) {
        decompress8(in_stack_00000038,(char *)in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                    in_stack_00000024);
      }
      else {
        decompress16(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                     in_stack_00000024);
      }
    }
    else if ((*(byte *)(in_RDI + 0x32) & 2) == 0) {
      decompress8(in_stack_00000038,(char *)in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                  in_stack_00000024);
      decompress8(in_stack_00000038,(char *)in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                  in_stack_00000024);
    }
    else {
      decompress16(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                   in_stack_00000024);
      decompress16(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                   in_stack_00000024);
    }
    iVar4 = dumbfile_error(in_RDX);
    if (iVar4 == 0) {
      if ((in_SIL & 1) == 0) {
        if ((*(byte *)(in_RDI + 0x32) & 2) == 0) {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar4) =
                 *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar4) ^ 0x80;
          }
        }
        else {
          for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
            *(ushort *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) =
                 *(ushort *)(*(long *)(in_RDI + 0x58) + (long)iVar4 * 2) ^ 0x8000;
          }
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int32 it_read_sample_data(IT_SAMPLE *sample, unsigned char convert, DUMBFILE *f)
{
	int32 n;

	int32 datasize = sample->length;
	if (sample->flags & IT_SAMPLE_STEREO) datasize <<= 1;

	sample->data = malloc(datasize * (sample->flags & IT_SAMPLE_16BIT ? 2 : 1));
	if (!sample->data)
		return -1;

	if (!(sample->flags & IT_SAMPLE_16BIT) && (convert == 0xFF)) {
		if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
			return -1;
	} else if (sample->flags & 8) {
		/* If the sample is packed, then we must unpack it. */

		/* Behavior as defined by greasemonkey's munch.py and observed by XMPlay and OpenMPT */

		if (sample->flags & IT_SAMPLE_STEREO) {
			if (sample->flags & IT_SAMPLE_16BIT) {
				decompress16(f, (short *) sample->data, datasize >> 1, convert & 4, 1);
				decompress16(f, (short *) sample->data + 1, datasize >> 1, convert & 4, 1);
			} else {
				decompress8(f, (signed char *) sample->data, datasize >> 1, convert & 4, 1);
				decompress8(f, (signed char *) sample->data + 1, datasize >> 1, convert & 4, 1);
			}
		} else {
			if (sample->flags & IT_SAMPLE_16BIT)
				decompress16(f, (short *) sample->data, datasize, convert & 4, 0);
			else
				decompress8(f, (signed char *) sample->data, datasize, convert & 4, 0);
		}
 	} else if (sample->flags & IT_SAMPLE_16BIT) {
		if (sample->flags & IT_SAMPLE_STEREO) {
			if (convert & 2) {
				for (n = 0; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
				for (n = 1; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
			} else {
				for (n = 0; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_igetw(f);
				for (n = 1; n < datasize; n += 2)
					((short *)sample->data)[n] = dumbfile_igetw(f);
			}
		} else {
 			if (convert & 2)
				for (n = 0; n < datasize; n++)
					((short *)sample->data)[n] = dumbfile_mgetw(f);
			else
				for (n = 0; n < datasize; n++)
					((short *)sample->data)[n] = dumbfile_igetw(f);
		}
 	} else {
		if (sample->flags & IT_SAMPLE_STEREO) {
			for (n = 0; n < datasize; n += 2)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
			for (n = 1; n < datasize; n += 2)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
		} else
			for (n = 0; n < datasize; n++)
				((signed char *)sample->data)[n] = dumbfile_getc(f);
	}

	if (dumbfile_error(f))
		return -1;

	if (!(convert & 1)) {
		/* Convert to signed. */
		if (sample->flags & IT_SAMPLE_16BIT)
			for (n = 0; n < datasize; n++)
				((short *)sample->data)[n] ^= 0x8000;
		else
			for (n = 0; n < datasize; n++)
				((signed char *)sample->data)[n] ^= 0x80;
	}

	/* NOT SUPPORTED:
	 *
	 * convert &  4 - Samples stored as delta values
	 * convert & 16 - Samples stored as TX-Wave 12-bit values
	 * convert & 32 - Left/Right/All Stereo prompt
	 */

	return 0;
}